

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreateP2pkhLockingScript
                   (Script *__return_storage_ptr__,ByteData160 *pubkey_hash)

{
  undefined1 local_38 [8];
  ScriptBuilder builder;
  ByteData160 *pubkey_hash_local;
  
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pubkey_hash;
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_38);
  ScriptBuilder::AppendOperator((ScriptBuilder *)local_38,(ScriptOperator *)ScriptOperator::OP_DUP);
  ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_38,(ScriptOperator *)ScriptOperator::OP_HASH160);
  ScriptBuilder::AppendData
            ((ScriptBuilder *)local_38,
             (ByteData160 *)
             builder.script_byte_array_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_38,(ScriptOperator *)ScriptOperator::OP_EQUALVERIFY);
  ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_38,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
  ScriptBuilder::Build(__return_storage_ptr__,(ScriptBuilder *)local_38);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkhLockingScript(const ByteData160& pubkey_hash) {
  // script作成
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);

  return builder.Build();
}